

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_property.c
# Opt level: O0

int mpt_graph_set(mpt_graph *gr,char *name,mpt_convertable *src)

{
  char cVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  char *pcVar5;
  int local_98;
  int local_8c;
  int local_88;
  int local_84;
  mpt_graph *local_80;
  byte local_69;
  char *pcStack_68;
  uint8_t n_1;
  char *v_1;
  int i;
  uint8_t n;
  char *v;
  mpt_graph *pmStack_48;
  int type_1;
  mpt_graph *from_1;
  mpt_graph *pmStack_38;
  int type;
  mpt_graph *from;
  mpt_convertable *pmStack_28;
  int len;
  mpt_convertable *src_local;
  char *name_local;
  mpt_graph *gr_local;
  
  pmStack_28 = src;
  src_local = (mpt_convertable *)name;
  name_local = (char *)gr;
  if (name == (char *)0x0) {
    if (src == (mpt_convertable *)0x0) {
      gr_local._4_4_ = -4;
    }
    else {
      from_1._4_4_ = mpt_graph_pointer_typeid();
      if ((from_1._4_4_ < 1) ||
         (from._4_4_ = (*pmStack_28->_vptr->convert)
                                 (pmStack_28,(long)from_1._4_4_,&stack0xffffffffffffffc8),
         from._4_4_ < 0)) {
        from_1._4_4_ = mpt_color_typeid();
        if ((from_1._4_4_ < 1) ||
           (iVar3 = (*pmStack_28->_vptr->convert)(pmStack_28,(long)from_1._4_4_,name_local + 0x10),
           iVar3 < 0)) {
          gr_local._4_4_ = -3;
        }
        else {
          if (iVar3 == 0) {
            name_local[0x10] = -1;
            name_local[0x11] = '\0';
            name_local[0x12] = '\0';
            name_local[0x13] = '\0';
          }
          gr_local._4_4_ = 0;
        }
      }
      else {
        mpt_graph_fini((mpt_graph *)name_local);
        if (from._4_4_ == 0) {
          local_80 = (mpt_graph *)0x0;
        }
        else {
          local_80 = pmStack_38;
        }
        mpt_graph_init((mpt_graph *)name_local,local_80);
        gr_local._4_4_ = 0;
      }
    }
  }
  else if (*name == '\0') {
    if (src == (mpt_convertable *)0x0) {
      mpt_graph_fini(gr);
      gr_local._4_4_ = 0;
    }
    else {
      v._4_4_ = mpt_graph_pointer_typeid();
      if ((v._4_4_ < 1) ||
         (from._4_4_ = (*pmStack_28->_vptr->convert)
                                 (pmStack_28,(long)v._4_4_,&stack0xffffffffffffffb8), from._4_4_ < 0
         )) {
        gr_local._4_4_ = -3;
      }
      else {
        mpt_graph_fini((mpt_graph *)name_local);
        mpt_graph_init((mpt_graph *)name_local,pmStack_48);
        if (from._4_4_ < 1) {
          local_84 = from._4_4_;
        }
        else {
          local_84 = 1;
        }
        gr_local._4_4_ = local_84;
      }
    }
  }
  else {
    iVar3 = strcmp(name,"fg");
    if ((iVar3 == 0) || (iVar3 = strcasecmp((char *)src_local,"foreground"), iVar3 == 0)) {
      if (pmStack_28 == (mpt_convertable *)0x0) {
        name_local[0x10] = -1;
        name_local[0x11] = '\0';
        name_local[0x12] = '\0';
        name_local[0x13] = '\0';
        gr_local._4_4_ = 0;
      }
      else {
        gr_local._4_4_ = mpt_color_pset((mpt_color *)(name_local + 0x10),pmStack_28);
      }
    }
    else {
      iVar3 = strcmp((char *)src_local,"bg");
      if ((iVar3 == 0) || (iVar3 = strcasecmp((char *)src_local,"background"), iVar3 == 0)) {
        if (pmStack_28 == (mpt_convertable *)0x0) {
          name_local[0x14] = '\0';
          name_local[0x15] = -1;
          name_local[0x16] = -1;
          name_local[0x17] = -1;
          gr_local._4_4_ = 0;
        }
        else {
          gr_local._4_4_ = mpt_color_pset((mpt_color *)(name_local + 0x14),pmStack_28);
        }
      }
      else {
        iVar3 = strcmp((char *)src_local,"pos");
        if ((iVar3 == 0) || (iVar3 = strcasecmp((char *)src_local,"position"), iVar3 == 0)) {
          if ((pmStack_28 == (mpt_convertable *)0x0) ||
             (local_88 = mpt_fpoint_set((mpt_fpoint *)(name_local + 0x18),pmStack_28,
                                        &mpt_graph_set::r), local_88 == 0)) {
            ((mpt_fpoint *)(name_local + 0x18))->x = 0.0;
            ((mpt_fpoint *)(name_local + 0x18))->y = 0.0;
            gr_local._4_4_ = 0;
          }
          else {
            if (-1 < local_88) {
              local_88 = 0;
            }
            gr_local._4_4_ = local_88;
          }
        }
        else {
          iVar3 = strcasecmp((char *)src_local,"scale");
          if (iVar3 == 0) {
            if ((pmStack_28 == (mpt_convertable *)0x0) ||
               (gr_local._4_4_ =
                     mpt_fpoint_set((mpt_fpoint *)(name_local + 0x20),pmStack_28,&mpt_graph_set::r_1
                                   ), gr_local._4_4_ == 0)) {
              ((mpt_fpoint *)(name_local + 0x20))->x = 1.0;
              ((mpt_fpoint *)(name_local + 0x20))->y = 1.0;
              gr_local._4_4_ = 0;
            }
          }
          else {
            iVar3 = strcmp((char *)src_local,"type");
            if ((iVar3 == 0) || (iVar3 = strcasecmp((char *)src_local,"gridtype"), iVar3 == 0)) {
              if ((pmStack_28 == (mpt_convertable *)0x0) ||
                 (local_8c = (*pmStack_28->_vptr->convert)(pmStack_28,99,name_local + 0x28),
                 local_8c == 0)) {
                name_local[0x28] = '\0';
                gr_local._4_4_ = 0;
              }
              else {
                if (-1 < local_8c) {
                  local_8c = 0;
                }
                gr_local._4_4_ = local_8c;
              }
            }
            else {
              iVar3 = strcmp((char *)src_local,"align");
              if ((iVar3 == 0) || (iVar3 = strcasecmp((char *)src_local,"alignment"), iVar3 == 0)) {
                v_1._7_1_ = 0;
                v_1._0_4_ = 0;
                if ((pmStack_28 == (mpt_convertable *)0x0) ||
                   (from._4_4_ = (*pmStack_28->_vptr->convert)(pmStack_28,0x79,name_local + 0x29),
                   from._4_4_ == 0)) {
                  name_local[0x29] = '\0';
                  gr_local._4_4_ = 0;
                }
                else if (from._4_4_ == 0) {
                  gr_local._4_4_ = (*pmStack_28->_vptr->convert)(pmStack_28,0x73,&i);
                  if (-1 < gr_local._4_4_) {
                    if ((gr_local._4_4_ != 0) && (_i != 0)) {
LAB_00108111:
                      do {
                        while( true ) {
                          do {
                            if ((*(char *)(_i + (int)v_1) == '\0') || (3 < (int)v_1))
                            goto LAB_001081fa;
                            lVar4 = (long)(int)v_1;
                            v_1._0_4_ = (int)v_1 + 1;
                            cVar1 = *(char *)(_i + lVar4);
                          } while (cVar1 == '\0');
                          cVar2 = (char)(int)v_1;
                          if (cVar1 != 'B') break;
LAB_001081a6:
                          v_1._7_1_ = v_1._7_1_ | (byte)(1 << (cVar2 * '\x02' & 0x1fU));
                        }
                        if (cVar1 != 'E') {
                          if (cVar1 != 'Z') {
                            if (cVar1 == 'b') goto LAB_001081a6;
                            if (cVar1 == 'e') goto LAB_001081bf;
                            if (cVar1 != 'z') goto LAB_00108111;
                          }
                          v_1._7_1_ = v_1._7_1_ | (byte)(3 << (cVar2 * '\x02' & 0x1fU));
                          goto LAB_00108111;
                        }
LAB_001081bf:
                        v_1._7_1_ = v_1._7_1_ | (byte)(2 << (cVar2 * '\x02' & 0x1fU));
                      } while( true );
                    }
                    v_1._7_1_ = 0;
LAB_001081fa:
                    name_local[0x29] = v_1._7_1_;
                    gr_local._4_4_ = 0;
                  }
                }
                else {
                  gr_local._4_4_ = 0;
                }
              }
              else {
                iVar3 = strcmp((char *)src_local,"clip");
                if ((iVar3 == 0) || (iVar3 = strcasecmp((char *)src_local,"clipping"), iVar3 == 0))
                {
                  local_69 = 0;
                  if ((pmStack_28 == (mpt_convertable *)0x0) ||
                     (from._4_4_ = (*pmStack_28->_vptr->convert)(pmStack_28,0x79,name_local + 0x2b),
                     from._4_4_ == 0)) {
                    name_local[0x2b] = '\0';
                    gr_local._4_4_ = 0;
                  }
                  else if (from._4_4_ == 0) {
                    gr_local._4_4_ =
                         (*pmStack_28->_vptr->convert)(pmStack_28,0x73,&stack0xffffffffffffff98);
                    if (-1 < gr_local._4_4_) {
                      if ((gr_local._4_4_ == 0) || (pcStack_68 == (char *)0x0)) {
                        name_local[0x2b] = '\0';
                        gr_local._4_4_ = 0;
                      }
                      else {
                        while (*pcStack_68 != '\0') {
                          pcVar5 = pcStack_68 + 1;
                          cVar1 = *pcStack_68;
                          pcStack_68 = pcVar5;
                          if (cVar1 == 'x') {
                            local_69 = local_69 | 1;
                          }
                          else if (cVar1 == 'y') {
                            local_69 = local_69 | 2;
                          }
                          else if (cVar1 == 'z') {
                            local_69 = local_69 | 4;
                          }
                          else {
                            local_69 = local_69 | 8;
                          }
                        }
                        name_local[0x2b] = local_69;
                        gr_local._4_4_ = 0;
                      }
                    }
                  }
                  else {
                    gr_local._4_4_ = 0;
                  }
                }
                else {
                  iVar3 = strcmp((char *)src_local,"lpos");
                  if (iVar3 == 0) {
                    if ((pmStack_28 == (mpt_convertable *)0x0) ||
                       (local_98 = (*pmStack_28->_vptr->convert)(pmStack_28,99,name_local + 0x2c),
                       local_98 == 0)) {
                      name_local[0x2c] = '\0';
                      gr_local._4_4_ = 0;
                    }
                    else {
                      if (-1 < local_98) {
                        local_98 = 0;
                      }
                      gr_local._4_4_ = local_98;
                    }
                  }
                  else {
                    iVar3 = strcmp((char *)src_local,"axes");
                    if (iVar3 == 0) {
                      if (pmStack_28 == (mpt_convertable *)0x0) {
                        mpt_string_set((char **)name_local,(char *)0x0,0);
                        gr_local._4_4_ = 0;
                      }
                      else {
                        gr_local._4_4_ = mpt_string_pset((char **)name_local,pmStack_28);
                      }
                    }
                    else {
                      iVar3 = strcmp((char *)src_local,"worlds");
                      if (iVar3 == 0) {
                        if (pmStack_28 == (mpt_convertable *)0x0) {
                          mpt_string_set((char **)(name_local + 8),(char *)0x0,0);
                          gr_local._4_4_ = 0;
                        }
                        else {
                          gr_local._4_4_ = mpt_string_pset((char **)(name_local + 8),pmStack_28);
                        }
                      }
                      else {
                        gr_local._4_4_ = -1;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return gr_local._4_4_;
}

Assistant:

extern int mpt_graph_set(MPT_STRUCT(graph) *gr, const char *name, MPT_INTERFACE(convertable) *src)
{
	int len;
	
	/* auto-select matching property */
	if (!name) {
		const MPT_STRUCT(graph) *from;
		int type;
		
		if (!src) {
			return MPT_ERROR(BadOperation);
		}
		if ((type = mpt_graph_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_graph_fini(gr);
			mpt_graph_init(gr, len ? from : 0);
			return 0;
		}
		if ((type = mpt_color_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &gr->fg)) >= 0) {
			if (!len) gr->fg = def_graph.fg;
			return 0;
		}
		return MPT_ERROR(BadType);
	}
	/* copy from sibling */
	if (!*name) {
		const MPT_STRUCT(graph) *from;
		int type;
		
		if (!src) {
			mpt_graph_fini(gr);
			return 0;
		}
		if ((type = mpt_graph_pointer_typeid()) > 0
		 && (len = src->_vptr->convert(src, type, &from)) >= 0) {
			mpt_graph_fini(gr);
			mpt_graph_init(gr, from);
			return len <= 0 ? len : 1;
		}
		return MPT_ERROR(BadType);
	}
	if (!strcmp(name, "fg") || !strcasecmp(name, "foreground")) {
		if (!src) {
			gr->fg = def_graph.fg;
			return 0;
		}
		return mpt_color_pset(&gr->fg, src);
	}
	if (!strcmp(name, "bg") || !strcasecmp(name, "background")) {
		if (!src) {
			gr->bg = def_graph.bg;
			return 0;
		}
		return mpt_color_pset(&gr->bg, src);
	}
	if (!strcmp(name, "pos") || !strcasecmp(name, "position")) {
		static const MPT_STRUCT(range) r = { 0.0, 1.0 };
		if (!src || !(len = mpt_fpoint_set(&gr->pos, src, &r))) {
			gr->pos = def_graph.pos;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcasecmp(name, "scale")) {
		static const MPT_STRUCT(range) r = { 0.0, FLT_MAX };
		if (!src || !(len = mpt_fpoint_set(&gr->scale, src, &r))) {
			gr->scale = def_graph.scale;
			return 0;
		}
		return len;
	}
	if (!strcmp(name, "type") || !strcasecmp(name, "gridtype")) {
		if (!src || !(len = src->_vptr->convert(src, 'c', &gr->grid))) {
			gr->grid = def_graph.grid;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcmp(name, "align") || !strcasecmp(name, "alignment")) {
		const char *v;
		uint8_t n = 0;
		int i = 0;
		
		if (!src || !(len = src->_vptr->convert(src, 'y', &gr->align))) {
			gr->align = def_graph.align;
			return 0;
		}
		if (len) {
			return 0;
		}
		if ((len = src->_vptr->convert(src, 's', &v)) < 0) {
			return len;
		}
		if (!len || !v) {
			n = 0;
		}
		else while (v[i]) {
			if (i >= 4) {
				break;
			}
			switch (v[i++]) {
			  case 0: len = i - 1; break;
			  case 'B': case 'b': n |= MPT_ENUM(AlignBegin) << i*2; break;
			  case 'E': case 'e': n |= MPT_ENUM(AlignEnd)   << i*2; break;
			  case 'Z': case 'z': n |= MPT_ENUM(AlignZero)  << i*2; break;
			  default:;
			}
		}
		gr->align = n;
		
		return 0;
	}
	if (!strcmp(name, "clip") || !strcasecmp(name, "clipping")) {
		const char *v;
		uint8_t n = 0;
		
		if (!src || !(len = src->_vptr->convert(src, 'y', &gr->clip))) {
			gr->clip = def_graph.clip;
			return 0;
		}
		if (len) {
			return 0;
		}
		if ((len = src->_vptr->convert(src, 's', &v)) < 0) {
			return len;
		}
		if (!len || !v) {
			gr->clip = def_graph.clip;
			return 0;
		}
		while (*v) {
			switch (*v++) {
			  case 'x': n |= 1; break;
			  case 'y': n |= 2; break;
			  case 'z': n |= 4; break;
			  default:  n |= 8;
			}
		}
		gr->clip = n;
		return 0;
	}
	if (!strcmp(name, "lpos")) {
		if (!src || !(len = src->_vptr->convert(src, 'c', &gr->lpos))) {
			gr->lpos = def_graph.lpos;
			return 0;
		}
		return len < 0 ? len : 0;
	}
	if (!strcmp(name, "axes")) {
		if (!src) {
			mpt_string_set(&gr->_axes, 0, 0);
			return 0;
		}
		return mpt_string_pset(&gr->_axes, src);
	}
	if (!strcmp(name, "worlds")) {
		if (!src) {
			mpt_string_set(&gr->_worlds, 0, 0);
			return 0;
		}
		return mpt_string_pset(&gr->_worlds, src);
	}
	return MPT_ERROR(BadArgument);
}